

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

SubexpressionNode __thiscall
JsUtil::Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
::Pop(Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
      *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  Type *pTVar4;
  SubexpressionNode SVar5;
  Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
  *this_local;
  SubexpressionNode item;
  
  iVar3 = ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count((ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
                   *)this);
  pTVar4 = List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(&this->list,iVar3 + -1);
  uVar1 = pTVar4->node;
  uVar2 = pTVar4->beginCodeSpan;
  SVar5.beginCodeSpan = uVar2;
  SVar5.node = (ParseNode *)uVar1;
  iVar3 = ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count((ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
                   *)this);
  List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAt(&this->list,iVar3 + -1);
  SVar5._12_4_ = 0;
  return SVar5;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }